

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgesture.cpp
# Opt level: O2

void __thiscall QGesture::QGesture(QGesture *this,QObject *parent)

{
  QGesturePrivate *this_00;
  
  this_00 = (QGesturePrivate *)operator_new(0xa8);
  QGesturePrivate::QGesturePrivate(this_00);
  QObject::QObject(&this->super_QObject,(QObjectPrivate *)this_00,parent);
  *(undefined ***)this = &PTR_metaObject_007bfe20;
  *(undefined4 *)(*(long *)&this->field_0x8 + 0x78) = 0x100;
  return;
}

Assistant:

QGesture::QGesture(QObject *parent)
    : QObject(*new QGesturePrivate, parent)
{
    d_func()->gestureType = Qt::CustomGesture;
}